

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::ReadListFile(cmMakefile *this,char *filename)

{
  bool bVar1;
  bool bVar2;
  char *in_base;
  cmListFile listFile;
  string filenametoread;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_58,filename,&local_59);
  in_base = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
  cmsys::SystemTools::CollapseFullPath(&local_38,&local_58,in_base);
  std::__cxx11::string::~string((string *)&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ListFileStack,&local_38);
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  bVar1 = cmListFile::ParseFile((cmListFile *)&local_58,local_38._M_dataplus._M_p,false,this);
  if (bVar1) {
    PushPolicyBarrier(this);
    ReadListFile(this,(cmListFile *)&local_58,&local_38);
    bVar2 = cmSystemTools::GetFatalErrorOccured();
    PopPolicyBarrier(this,!bVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&this->ListFileStack);
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool cmMakefile::ReadListFile(const char* filename)
{
  std::string filenametoread =
    cmSystemTools::CollapseFullPath(filename,
                                    this->GetCurrentSourceDirectory());

  this->ListFileStack.push_back(filenametoread);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), false, this))
    {
    return false;
    }

  this->PushPolicyBarrier();
  this->ReadListFile(listFile, filenametoread);
  this->PopPolicyBarrier(!cmSystemTools::GetFatalErrorOccured());
  this->ListFileStack.pop_back();
  return true;
}